

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sin.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *this;
  int iVar4;
  int iVar5;
  double dVar6;
  int output_length;
  int tmp;
  double amplitude;
  double period;
  ostringstream error_message;
  int local_1f4;
  string local_1f0;
  char **local_1d0;
  int local_1c4;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1f4 = -1;
  local_1b0 = 10.0;
  local_1b8 = 1.0;
  iVar4 = 0;
  iVar5 = 0;
  local_1d0 = argv;
  do {
    iVar3 = ya_getopt_long(argc,argv,"l:m:p:a:o:h",(option *)0x0,(int *)0x0);
    switch(iVar3) {
    case 0x68:
      anon_unknown.dwarf_225e::PrintUsage((ostream *)&std::cout);
      iVar5 = 0;
      iVar3 = 1;
      break;
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
switchD_001026cd_caseD_69:
      anon_unknown.dwarf_225e::PrintUsage((ostream *)&std::cerr);
      goto LAB_00102ae2;
    case 0x6c:
      std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_1f0);
      bVar2 = sptk::ConvertStringToInteger(local_1a8,&local_1f4);
      bVar1 = local_1f4 < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      if (!bVar2 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The argument for the -l option must be a positive integer",
                   0x39);
        argv = local_1d0;
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"sin","");
        sptk::PrintErrorMessage(&local_1f0,(ostringstream *)local_1a8);
        goto LAB_00102ab2;
      }
LAB_00102900:
      iVar3 = 0;
      argv = local_1d0;
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_1f0);
      bVar1 = sptk::ConvertStringToInteger(local_1a8,&local_1f4);
      bVar2 = -1 < local_1f4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      if (bVar1 && bVar2) {
        local_1f4 = local_1f4 + 1;
        goto LAB_00102900;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "The argument for the -m option must be a non-negative integer",0x3d);
      argv = local_1d0;
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"sin","");
      sptk::PrintErrorMessage(&local_1f0,(ostringstream *)local_1a8);
      goto LAB_00102ab2;
    case 0x6f:
      std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_1f0);
      bVar1 = sptk::ConvertStringToInteger(local_1a8,&local_1c4);
      if (bVar1) {
        bVar1 = sptk::IsInRange(local_1c4,0,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if (bVar1) {
          iVar3 = 0;
          iVar4 = local_1c4;
          break;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The argument for the -o option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"in the range of ",0x10);
      this = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0);
      std::__ostream_insert<char,std::char_traits<char>>(this," to ",4);
      std::ostream::operator<<((ostream *)this,1);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"sin","");
      sptk::PrintErrorMessage(&local_1f0,(ostringstream *)local_1a8);
      goto LAB_00102ab2;
    case 0x70:
      std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_1f0);
      bVar2 = sptk::ConvertStringToDouble(local_1a8,&local_1b0);
      bVar1 = 0.0 < local_1b0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      if (bVar2 && bVar1) goto LAB_00102900;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The argument for the -p option must be a positive number",
                 0x38);
      argv = local_1d0;
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"sin","");
      sptk::PrintErrorMessage(&local_1f0,(ostringstream *)local_1a8);
LAB_00102ab2:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
LAB_00102ae2:
      iVar3 = 1;
      iVar5 = 1;
      break;
    default:
      if (iVar3 == -1) {
        iVar3 = 2;
      }
      else {
        if (iVar3 != 0x61) goto switchD_001026cd_caseD_69;
        std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_1f0);
        bVar1 = sptk::ConvertStringToDouble(local_1a8,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"The argument for the -a option must be numeric",0x2e);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"sin","");
          sptk::PrintErrorMessage(&local_1f0,(ostringstream *)local_1a8);
          goto LAB_00102ab2;
        }
        iVar3 = 0;
      }
    }
  } while (iVar3 == 0);
  if (iVar3 == 2) {
    if (ya_optind == argc) {
      bVar1 = sptk::SetBinaryMode();
      if (bVar1) {
        if (local_1f4 == -1 || 0 < local_1f4) {
          local_1d0 = (char **)(6.283185307179586 / local_1b0);
          iVar3 = 1;
          do {
            if (iVar4 == 1) {
              local_1c0 = local_1b8;
              dVar6 = cos((double)(iVar3 + -1) * (double)local_1d0);
LAB_00102bac:
              bVar2 = sptk::WriteStream<double>(dVar6 * local_1c0,(ostream *)&std::cout);
              bVar1 = true;
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Failed to write sinusoidal sequence",0x23);
                local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"sin","");
                sptk::PrintErrorMessage(&local_1f0,(ostringstream *)local_1a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
                goto LAB_00102c37;
              }
            }
            else {
              if (iVar4 == 0) {
                local_1c0 = local_1b8;
                dVar6 = sin((double)(iVar3 + -1) * (double)local_1d0);
                goto LAB_00102bac;
              }
LAB_00102c37:
              bVar1 = false;
              iVar5 = 1;
            }
            if (!bVar1) {
              return iVar5;
            }
            bVar1 = iVar3 < local_1f4;
            iVar3 = iVar3 + 1;
          } while (local_1f4 == -1 || bVar1);
        }
        return 0;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Cannot set translation mode",0x1b);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"sin","");
      sptk::PrintErrorMessage(&local_1f0,(ostringstream *)local_1a8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Input file is not required",0x1a);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"sin","");
      sptk::PrintErrorMessage(&local_1f0,(ostringstream *)local_1a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int output_length(kMagicNumberForInfinity);
  double period(kDefaultPeriod);
  double amplitude(kDefaultAmplitude);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:p:a:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &output_length) ||
            output_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &output_length) ||
            output_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        ++output_length;
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToDouble(optarg, &period) || period <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive number";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &amplitude)) {
          std::ostringstream error_message;
          error_message << "The argument for the -a option must be numeric";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (0 != argc - optind) {
    std::ostringstream error_message;
    error_message << "Input file is not required";
    sptk::PrintErrorMessage("sin", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("sin", error_message);
    return 1;
  }

  const double omega(sptk::kTwoPi / period);
  for (int i(0); kMagicNumberForInfinity == output_length || i < output_length;
       ++i) {
    double output;
    switch (output_format) {
      case kSine: {
        output = amplitude * std::sin(omega * i);
        break;
      }
      case kCosine: {
        output = amplitude * std::cos(omega * i);
        break;
      }
      default: {
        return 1;
      }
    }
    if (!sptk::WriteStream(output, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write sinusoidal sequence";
      sptk::PrintErrorMessage("sin", error_message);
      return 1;
    }
  }

  return 0;
}